

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isIDIgnorable_63(UChar32 c)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  bool local_17;
  bool local_16;
  byte local_15;
  uint32_t props;
  UChar32 c_local;
  
  if (c < 0xa0) {
    UVar1 = u_isISOControl_63(c);
    local_15 = 0;
    if (UVar1 != '\0') {
      local_16 = false;
      if ((c < 0x20) && (local_16 = false, 8 < c)) {
        local_17 = c < 0xe || 0x1b < c;
        local_16 = local_17;
      }
      local_15 = local_16 ^ 0xff;
    }
    props._3_1_ = (bool)(local_15 & 1);
  }
  else {
    uVar2 = c >> 5;
    if ((uint)c < 0xd800) {
      local_24 = (uint)propsTrie_index[(int)uVar2] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar3 = 0;
        if (c < 0xdc00) {
          iVar3 = 0x140;
        }
        local_28 = (uint)propsTrie_index[(int)(iVar3 + uVar2)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < 0x110000) {
            local_30 = (uint)propsTrie_index
                             [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))] * 4
                       + (c & 0x1fU);
          }
          else {
            local_30 = 0x53c8;
          }
          local_2c = local_30;
        }
        else {
          local_2c = 0x11f4;
        }
        local_28 = local_2c;
      }
      local_24 = local_28;
    }
    props._3_1_ = (propsTrie_index[local_24] & 0x1f) == 0x10;
  }
  return props._3_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isIDIgnorable(UChar32 c) {
    if(c<=0x9f) {
        return u_isISOControl(c) && !IS_THAT_ASCII_CONTROL_SPACE(c);
    } else {
        uint32_t props;
        GET_PROPS(c, props);
        return (UBool)(GET_CATEGORY(props)==U_FORMAT_CHAR);
    }
}